

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O3

bool __thiscall
cmBuildCommand::MainSignature
          (cmBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  cmGlobalGenerator *this_01;
  ostream *poVar4;
  uint uVar5;
  pointer pbVar6;
  string *psVar7;
  ulong uVar8;
  int iVar9;
  string configuration;
  string project_name;
  string target;
  string makecommand;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 == pbVar1) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"requires at least one argument naming a CMake variable","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  iVar9 = 0;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  if (0x20 < (ulong)((long)pbVar1 - (long)pbVar6)) {
    uVar8 = 1;
    uVar5 = 2;
    local_1b0 = pbVar6;
    do {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar6 + uVar8));
      if (iVar3 == 0) {
        iVar9 = 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar8));
        if (iVar3 == 0) {
          iVar9 = 2;
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar8));
          if (iVar3 == 0) {
            iVar9 = 3;
          }
          else {
            psVar7 = &local_230;
            if (iVar9 != 1) {
              if (iVar9 == 3) {
                psVar7 = &local_1d0;
              }
              else {
                if (iVar9 != 2) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"unknown argument \"",0x12);
                  pbVar6 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,pbVar6[uVar8]._M_dataplus._M_p,
                                      pbVar6[uVar8]._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_210);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  bVar2 = false;
                  goto LAB_0028f753;
                }
                psVar7 = &local_1f0;
              }
            }
            iVar9 = 0;
            std::__cxx11::string::_M_assign((string *)psVar7);
          }
        }
      }
      uVar8 = (ulong)uVar5;
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
    } while (uVar8 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5))
    ;
    pbVar6 = local_1b0;
    if (local_230._M_string_length != 0) goto LAB_0028f63e;
  }
  cmsys::SystemTools::GetEnv("CMAKE_CONFIG_TYPE",&local_230);
  if (local_230._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_230,0,(char *)0x0,0x55741e);
  }
LAB_0028f63e:
  if (local_1f0._M_string_length != 0) {
    this_00 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Ignoring PROJECT_NAME option because it has no effect.","");
    cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  this_01 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  bVar2 = cmMakefile::IgnoreErrorsCMP0061((this->super_cmCommand).Makefile);
  cmGlobalGenerator::GenerateCMakeBuildCommand
            ((string *)local_1a8,this_01,&local_1d0,&local_230,&local_210,bVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar6,(char *)local_1a8._0_8_);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar2 = true;
LAB_0028f753:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool cmBuildCommand::MainSignature(std::vector<std::string> const& args)
{
  if (args.empty()) {
    this->SetError("requires at least one argument naming a CMake variable");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  // Parse remaining arguments.
  std::string configuration;
  std::string project_name;
  std::string target;
  enum Doing
  {
    DoingNone,
    DoingConfiguration,
    DoingProjectName,
    DoingTarget
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "CONFIGURATION") {
      doing = DoingConfiguration;
    } else if (args[i] == "PROJECT_NAME") {
      doing = DoingProjectName;
    } else if (args[i] == "TARGET") {
      doing = DoingTarget;
    } else if (doing == DoingConfiguration) {
      doing = DoingNone;
      configuration = args[i];
    } else if (doing == DoingProjectName) {
      doing = DoingNone;
      project_name = args[i];
    } else if (doing == DoingTarget) {
      doing = DoingNone;
      target = args[i];
    } else {
      std::ostringstream e;
      e << "unknown argument \"" << args[i] << "\"";
      this->SetError(e.str());
      return false;
    }
  }

  // If null/empty CONFIGURATION argument, cmake --build uses 'Debug'
  // in the currently implemented multi-configuration global generators...
  // so we put this code here to end up with the same default configuration
  // as the original 2-arg build_command signature:
  //
  if (configuration.empty()) {
    cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configuration);
  }
  if (configuration.empty()) {
    configuration = "Release";
  }

  if (!project_name.empty()) {
    this->Makefile->IssueMessage(
      cmake::AUTHOR_WARNING,
      "Ignoring PROJECT_NAME option because it has no effect.");
  }

  std::string makecommand =
    this->Makefile->GetGlobalGenerator()->GenerateCMakeBuildCommand(
      target, configuration, "", this->Makefile->IgnoreErrorsCMP0061());

  this->Makefile->AddDefinition(variable, makecommand.c_str());

  return true;
}